

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall RealCommandRunner::CanRunMore(RealCommandRunner *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  double dVar4;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool parallelism_limit_not_reached;
  RealCommandRunner *this_local;
  
  bVar1 = true;
  if (this->tokens_ == (TokenPool *)0x0) {
    sVar2 = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::size
                      (&(this->subprocs_).running_);
    sVar3 = std::queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_>::size
                      (&(this->subprocs_).finished_);
    bVar1 = (int)sVar2 + (int)sVar3 < *(int *)(this->config_ + 8);
  }
  local_29 = false;
  if (bVar1) {
    bVar1 = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::empty
                      (&(this->subprocs_).running_);
    local_2a = true;
    if (!bVar1) {
      local_2b = true;
      if (0.0 < this->max_load_average_) {
        dVar4 = GetLoadAverage();
        local_2b = dVar4 < this->max_load_average_;
      }
      local_2a = local_2b;
    }
    local_29 = local_2a;
  }
  return local_29;
}

Assistant:

bool RealCommandRunner::CanRunMore() const {
  bool parallelism_limit_not_reached =
    tokens_ || // ignore config_.parallelism
    ((int) (subprocs_.running_.size() +
            subprocs_.finished_.size()) < config_.parallelism);
  return parallelism_limit_not_reached
    && (subprocs_.running_.empty() ||
        (max_load_average_ <= 0.0f ||
         GetLoadAverage() < max_load_average_));
}